

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5StorageStmtRelease(Fts5Storage *p,int eStmt,sqlite3_stmt *pStmt)

{
  sqlite3_stmt *pStmt_local;
  int eStmt_local;
  Fts5Storage *p_local;
  
  if (p->aStmt[eStmt] == (sqlite3_stmt *)0x0) {
    sqlite3_reset(pStmt);
    p->aStmt[eStmt] = pStmt;
  }
  else {
    sqlite3_finalize(pStmt);
  }
  return;
}

Assistant:

static void sqlite3Fts5StorageStmtRelease(
  Fts5Storage *p, 
  int eStmt, 
  sqlite3_stmt *pStmt
){
  assert( eStmt==FTS5_STMT_SCAN_ASC
       || eStmt==FTS5_STMT_SCAN_DESC
       || eStmt==FTS5_STMT_LOOKUP
  );
  if( p->aStmt[eStmt]==0 ){
    sqlite3_reset(pStmt);
    p->aStmt[eStmt] = pStmt;
  }else{
    sqlite3_finalize(pStmt);
  }
}